

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O0

DdNode * cuddSplitSetRecur(DdManager *manager,st__table *mtable,int *varSeen,DdNode *p,double n,
                          double max,int index)

{
  DdHalfWord index_00;
  int iVar1;
  int positive;
  int variable;
  double numE;
  double numT;
  double *dummy;
  DdNode *result;
  DdNode *v;
  DdNode *r;
  DdNode *q;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  DdNode *zero;
  DdNode *one;
  double dStack_40;
  int index_local;
  double max_local;
  double n_local;
  DdNode *p_local;
  int *varSeen_local;
  st__table *mtable_local;
  DdManager *manager_local;
  
  zero = manager->one;
  N = (DdNode *)((ulong)zero ^ 1);
  one._4_4_ = index;
  dStack_40 = max;
  max_local = n;
  n_local = (double)p;
  p_local = (DdNode *)varSeen;
  varSeen_local = (int *)mtable;
  mtable_local = (st__table *)manager;
  if (*(int *)((ulong)p & 0xfffffffffffffffe) == 0x7fffffff) {
    manager_local = (DdManager *)selectMintermsFromUniverse(manager,varSeen,n);
  }
  else {
    Nv = (DdNode *)((ulong)p & 0xfffffffffffffffe);
    index_00 = Nv->index;
    varSeen[manager->invperm[(int)index_00]] = -1;
    Nnv = (Nv->type).kids.T;
    q = (Nv->type).kids.E;
    if (((ulong)p & 1) != 0) {
      Nnv = (DdNode *)((ulong)Nnv ^ 1);
      q = (DdNode *)((ulong)q ^ 1);
    }
    if ((*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) &&
       (*(int *)((ulong)q & 0xfffffffffffffffe) == 0x7fffffff)) {
      r = selectMintermsFromUniverse(manager,varSeen,n);
      if (r == (DdNode *)0x0) {
        manager_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
        v = cuddBddAndRecur((DdManager *)mtable_local,(DdNode *)n_local,r);
        if (v == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)mtable_local,r);
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref((DdManager *)mtable_local,r);
          *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
          manager_local = (DdManager *)v;
        }
      }
    }
    else {
      if (*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) {
        if (Nnv == zero) {
          numE = max / (double)((1 << ((byte)index & 0x1f)) << 1);
        }
        else {
          numE = 0.0;
        }
      }
      else {
        iVar1 = st__lookup(mtable,(char *)Nnv,(char **)&numT);
        if (iVar1 == 0) {
          return (DdNode *)0x0;
        }
        numE = *(double *)numT / (double)((1 << ((byte)one._4_4_ & 0x1f)) << 1);
      }
      if (*(int *)((ulong)q & 0xfffffffffffffffe) == 0x7fffffff) {
        if (q == zero) {
          _positive = dStack_40 / (double)((1 << ((byte)one._4_4_ & 0x1f)) << 1);
        }
        else {
          _positive = 0.0;
        }
      }
      else {
        iVar1 = st__lookup((st__table *)varSeen_local,(char *)q,(char **)&numT);
        if (iVar1 == 0) {
          return (DdNode *)0x0;
        }
        _positive = *(double *)numT / (double)((1 << ((byte)one._4_4_ & 0x1f)) << 1);
      }
      result = cuddUniqueInter((DdManager *)mtable_local,index_00,zero,N);
      *(int *)(((ulong)result & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)result & 0xfffffffffffffffe) + 4) + 1;
      if ((numE != max_local) || (NAN(numE) || NAN(max_local))) {
        if ((_positive != max_local) || (NAN(_positive) || NAN(max_local))) {
          if (max_local <= numE) {
            if (max_local <= _positive) {
              if ((*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) &&
                 (*(int *)((ulong)q & 0xfffffffffffffffe) != 0x7fffffff)) {
                r = selectMintermsFromUniverse((DdManager *)mtable_local,(int *)p_local,max_local);
                if (r == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                  manager_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
                  dummy = (double *)cuddBddAndRecur((DdManager *)mtable_local,result,r);
                  if ((DdNode *)dummy == (DdNode *)0x0) {
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    manager_local = (DdManager *)0x0;
                  }
                  else {
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + 1;
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + -1;
                    manager_local = (DdManager *)dummy;
                  }
                }
              }
              else if ((*(int *)((ulong)Nnv & 0xfffffffffffffffe) == 0x7fffffff) ||
                      (*(int *)((ulong)q & 0xfffffffffffffffe) != 0x7fffffff)) {
                if (_positive <= numE) {
                  r = cuddSplitSetRecur((DdManager *)mtable_local,(st__table *)varSeen_local,
                                        (int *)p_local,q,max_local,dStack_40,one._4_4_ + 1);
                }
                else {
                  r = cuddSplitSetRecur((DdManager *)mtable_local,(st__table *)varSeen_local,
                                        (int *)p_local,Nnv,max_local,dStack_40,one._4_4_ + 1);
                }
                if (r == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                  manager_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
                  if (_positive <= numE) {
                    dummy = (double *)
                            cuddBddAndRecur((DdManager *)mtable_local,(DdNode *)((ulong)result ^ 1),
                                            r);
                  }
                  else {
                    dummy = (double *)cuddBddAndRecur((DdManager *)mtable_local,result,r);
                  }
                  if (dummy == (double *)0x0) {
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    manager_local = (DdManager *)0x0;
                  }
                  else {
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + 1;
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + -1;
                    manager_local = (DdManager *)dummy;
                  }
                }
              }
              else {
                r = selectMintermsFromUniverse((DdManager *)mtable_local,(int *)p_local,max_local);
                if (r == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                  manager_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
                  dummy = (double *)
                          cuddBddAndRecur((DdManager *)mtable_local,(DdNode *)((ulong)result ^ 1),r)
                  ;
                  if ((DdNode *)dummy == (DdNode *)0x0) {
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    manager_local = (DdManager *)0x0;
                  }
                  else {
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + 1;
                    Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                    Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                    *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)dummy & 0xfffffffffffffffe) + 4) + -1;
                    manager_local = (DdManager *)dummy;
                  }
                }
              }
            }
            else {
              r = cuddSplitSetRecur((DdManager *)mtable_local,(st__table *)varSeen_local,
                                    (int *)p_local,Nnv,max_local - _positive,dStack_40,one._4_4_ + 1
                                   );
              if (r == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                manager_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
                v = cuddBddIteRecur((DdManager *)mtable_local,result,r,q);
                if (v == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                  Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                  manager_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
                  Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                  Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                  *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
                  manager_local = (DdManager *)v;
                }
              }
            }
          }
          else {
            r = cuddSplitSetRecur((DdManager *)mtable_local,(st__table *)varSeen_local,
                                  (int *)p_local,q,max_local - numE,dStack_40,one._4_4_ + 1);
            if (r == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)mtable_local,result);
              manager_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
              v = cuddBddIteRecur((DdManager *)mtable_local,result,Nnv,r);
              if (v == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                manager_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref((DdManager *)mtable_local,r);
                Cudd_RecursiveDeref((DdManager *)mtable_local,result);
                *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
                manager_local = (DdManager *)v;
              }
            }
          }
        }
        else {
          r = cuddBddAndRecur((DdManager *)mtable_local,(DdNode *)((ulong)result ^ 1),q);
          if (r == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)mtable_local,result);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref((DdManager *)mtable_local,result);
            *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
            manager_local = (DdManager *)r;
          }
        }
      }
      else {
        r = cuddBddAndRecur((DdManager *)mtable_local,result,Nnv);
        if (r == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)mtable_local,result);
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref((DdManager *)mtable_local,result);
          *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)r & 0xfffffffffffffffe) + 4) + -1;
          manager_local = (DdManager *)r;
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode*
cuddSplitSetRecur(
  DdManager * manager,
  st__table * mtable,
  int * varSeen,
  DdNode * p,
  double  n,
  double  max,
  int  index)
{
    DdNode *one, *zero, *N, *Nv;
    DdNode *Nnv, *q, *r, *v;
    DdNode *result;
    double *dummy, numT, numE;
    int variable, positive;
  
    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* If p is constant, extract n minterms from constant 1.  The procedure by
    ** construction guarantees that minterms will not be extracted from
    ** constant 0.
    */
    if (Cudd_IsConstant(p)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        return(q);
    }

    N = Cudd_Regular(p);

    /* Set variable as seen. */
    variable = N->index;
    varSeen[manager->invperm[variable]] = -1;

    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (Cudd_IsComplement(p)) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* If both the children of 'p' are constants, extract n minterms from a
    ** constant node.
    */
    if (Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddAndRecur(manager,p,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        cuddDeref(r);
        return(r);
    }
  
    /* Lookup the # of minterms in the onset of the node from the table. */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mtable, (const char *)Nv, (char **)&dummy)) return(NULL);
        numT = *dummy/(2*(1<<index));
    } else if (Nv == one) {
        numT = max/(2*(1<<index));
    } else {
        numT = 0;
    }
  
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mtable, (const char *)Nnv, (char **)&dummy)) return(NULL);
        numE = *dummy/(2*(1<<index));
    } else if (Nnv == one) {
        numE = max/(2*(1<<index));
    } else {
        numE = 0;
    }

    v = cuddUniqueInter(manager,variable,one,zero);
    cuddRef(v);

    /* If perfect match. */
    if (numT == n) {
        q = cuddBddAndRecur(manager,v,Nv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    if (numE == n) {
        q = cuddBddAndRecur(manager,Cudd_Not(v),Nnv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    /* If n is greater than numT, extract the difference from the ELSE child
    ** and retain the function represented by the THEN branch.
    */
    if (numT < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,(n-numT),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,Nv,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);
        return(r);
    }
    /* If n is greater than numE, extract the difference from the THEN child
    ** and retain the function represented by the ELSE branch.
    */
    if (numE < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv, (n-numE),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,q,Nnv);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);    
        return(r);
    }

    /* None of the above cases; (n < numT and n < numE) and either of
    ** the Nv, Nnv or both are not constants. If possible extract the
    ** required minterms the constant branch.
    */
    if (Cudd_IsConstant(Nv) && !Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,v,q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    } else if (!Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    }

    /* Both Nv and Nnv are not constants. So choose the one which
    ** has fewer minterms in its onset.
    */
    positive = 0;
    if (numT < numE) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv,n,max,index+1);
        positive = 1;
    } else {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,n,max,index+1);
    }

    if (q == NULL) {
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(q);

    if (positive) {
        result = cuddBddAndRecur(manager,v,q);
    } else {
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
    }
    if (result == NULL) {
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(result);
    Cudd_RecursiveDeref(manager,q);
    Cudd_RecursiveDeref(manager,v);
    cuddDeref(result);

    return(result);

}